

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O3

bool __thiscall AKey::HandlePickup(AKey *this,AInventory *item)

{
  AInventory *pAVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar6;
  PClass *pPVar5;
  undefined4 extraout_var_00;
  
  if (multiplayer) {
    bVar2 = AInventory::HandlePickup(&this->super_AInventory,item);
    return bVar2;
  }
  pPVar5 = (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar4 = (**(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject)
                      (this);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
    (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class = pPVar5;
  }
  pPVar6 = (item->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar6 == (PClass *)0x0) {
    iVar4 = (**(item->super_AActor).super_DThinker.super_DObject._vptr_DObject)(item);
    pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar4);
    (item->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
  }
  if (pPVar5 == pPVar6) {
    *(byte *)&item->ItemFlags = (byte)item->ItemFlags | 4;
    bVar2 = true;
  }
  else {
    pAVar1 = (this->super_AInventory).super_AActor.Inventory.field_0.p;
    if (pAVar1 != (AInventory *)0x0) {
      if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        uVar3 = (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x37])
                          (pAVar1,item);
        return (bool)uVar3;
      }
      (this->super_AInventory).super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AKey::HandlePickup (AInventory *item)
{
	// In single player, you can pick up an infinite number of keys
	// even though you can only hold one of each.
	if (multiplayer)
	{
		return Super::HandlePickup (item);
	}
	if (GetClass() == item->GetClass())
	{
		item->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}